

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void UnaryExpression_typeof_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_40 [8];
  JsValue r1;
  JsAstUnaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  r1.u.reference.name = (char *)na;
  (*JsNodeClassEval[**(uint **)(na + 1)])(*(JsAstNode **)(na + 1),context,(JsValue *)local_40);
  UnaryExpression_typeof_eval_common(context,(JsValue *)local_40,res);
  return;
}

Assistant:

static void
UnaryExpression_typeof_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1;

	EVAL(n->a, context, &r1);
	UnaryExpression_typeof_eval_common(context, &r1, res);
}